

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::GBufferFilm::AddSplat
          (GBufferFilm *this,Point2f p,SampledSpectrum v,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  Tuple2<pbrt::Point2,_float> t;
  Tuple2<pbrt::Point2,_float> t_00;
  initializer_list<float> __l;
  SampledSpectrum L;
  bool bVar2;
  Point2i p_00;
  Pixel *pPVar3;
  Bounds2<int> *in_RDI;
  float fVar4;
  Float FVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  RGB RVar17;
  int i;
  Pixel *pixel;
  Float wt;
  Point2i pi;
  Bounds2iIterator __end1;
  Bounds2iIterator __begin1;
  Bounds2i *__range1;
  Bounds2i splatBounds;
  Point2f pDiscrete;
  Float m;
  RGB rgb;
  float in_stack_fffffffffffffe38;
  Float in_stack_fffffffffffffe3c;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffe40;
  Tuple2<pbrt::Vector2,_float> in_stack_fffffffffffffe48;
  Bounds2iIterator *this_00;
  undefined1 in_stack_fffffffffffffe68 [16];
  int local_184;
  char (*in_stack_fffffffffffffe80) [13];
  char *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  LogLevel in_stack_fffffffffffffea4;
  Bounds2iIterator local_128;
  Tuple2<pbrt::Point2,_int> *local_118;
  Bounds2<int> local_110;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  SampledWavelengths *in_stack_ffffffffffffff20;
  PixelSensor *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  Tuple2<pbrt::Point2,_int> local_9c;
  Tuple2<pbrt::Point2,_int> local_94;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar18;
  undefined4 uVar19;
  Float FVar20;
  RGB local_34 [2];
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  
  local_8 = vmovlpd_avx(in_ZMM0._0_16_);
  local_18 = vmovlpd_avx(in_ZMM1._0_16_);
  uStack_10 = vmovlpd_avx(in_XMM2);
  bVar2 = SampledSpectrum::HasNaNs((SampledSpectrum *)in_stack_fffffffffffffe48);
  if (bVar2) {
    LogFatal<char_const(&)[13]>
              (in_stack_fffffffffffffea4,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
               in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  }
  auVar16 = ZEXT856(0);
  L.values.values[2] = (float)(int)in_stack_ffffffffffffff38;
  L.values.values[3] = (float)(int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  L.values.values[0] = (float)(int)in_stack_ffffffffffffff30;
  L.values.values[1] = (float)(int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  RVar17 = PixelSensor::ToSensorRGB(in_stack_ffffffffffffff28,L,in_stack_ffffffffffffff20);
  local_34[0].b = RVar17.b;
  auVar6._0_8_ = RVar17._0_8_;
  auVar6._8_56_ = auVar16;
  local_34[0]._0_8_ = vmovlpd_avx(auVar6._0_16_);
  __l._M_array._4_4_ = in_stack_fffffffffffffe3c;
  __l._M_array._0_4_ = in_stack_fffffffffffffe38;
  __l._M_len._0_4_ = in_stack_fffffffffffffe40.x;
  __l._M_len._4_4_ = in_stack_fffffffffffffe40.y;
  FVar20 = local_34[0].r;
  fVar4 = std::max<float>(__l);
  if ((float)in_RDI[0x33].pMax.super_Tuple2<pbrt::Point2,_int>.x < fVar4) {
    RGB::operator*=(local_34,(float)in_RDI[0x33].pMax.super_Tuple2<pbrt::Point2,_int>.x / fVar4);
  }
  Vector2<float>::Vector2
            ((Vector2<float> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
             in_stack_fffffffffffffe38);
  auVar7._0_8_ = Point2<float>::operator+
                           (in_stack_fffffffffffffe40,(Vector2<float>)in_stack_fffffffffffffe48);
  auVar7._8_56_ = extraout_var;
  uVar1 = vmovlpd_avx(auVar7._0_16_);
  uVar18 = (undefined4)uVar1;
  uVar19 = (undefined4)((ulong)uVar1 >> 0x20);
  this_00 = (Bounds2iIterator *)&in_RDI[1].pMax;
  auVar8._0_8_ = Filter::Radius((Filter *)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar8._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar8._0_16_);
  auVar9._0_8_ = Point2<float>::operator-
                           (in_stack_fffffffffffffe40,(Vector2<float>)in_stack_fffffffffffffe48);
  auVar9._8_56_ = extraout_var_01;
  vmovlpd_avx(auVar9._0_16_);
  t.y = in_stack_fffffffffffffe3c;
  t.x = in_stack_fffffffffffffe38;
  auVar10._0_8_ = Floor<pbrt::Point2,float>(t);
  auVar10._8_56_ = extraout_var_02;
  vmovlpd_avx(auVar10._0_16_);
  Point2<int>::Point2<float>
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             (Point2<float>)in_stack_fffffffffffffe40);
  auVar11._0_8_ =
       Filter::Radius((Filter *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar11._8_56_ = extraout_var_03;
  local_f8 = vmovlpd_avx(auVar11._0_16_);
  auVar12._0_8_ =
       Point2<float>::operator+(in_stack_fffffffffffffe40,(Vector2<float>)in_stack_fffffffffffffe48)
  ;
  auVar12._8_56_ = extraout_var_04;
  local_f0 = vmovlpd_avx(auVar12._0_16_);
  t_00.y = in_stack_fffffffffffffe3c;
  t_00.x = in_stack_fffffffffffffe38;
  local_e8 = local_f0;
  auVar13._0_8_ = Floor<pbrt::Point2,float>(t_00);
  auVar13._8_56_ = extraout_var_05;
  vmovlpd_avx(auVar13._0_16_);
  Point2<int>::Point2<float>
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             (Point2<float>)in_stack_fffffffffffffe40);
  Vector2<int>::Vector2
            ((Vector2<int> *)in_stack_fffffffffffffe40,(int)in_stack_fffffffffffffe3c,
             (int)in_stack_fffffffffffffe38);
  Point2<int>::operator+
            ((Point2<int> *)in_stack_fffffffffffffe40,(Vector2<int>)in_stack_fffffffffffffe48);
  Bounds2<int>::Bounds2
            (in_RDI,(Point2<int>)in_stack_fffffffffffffe68._8_8_,
             (Point2<int>)in_stack_fffffffffffffe68._0_8_);
  local_110 = Intersect<int>(in_stack_fffffffffffffe68._8_8_,in_stack_fffffffffffffe68._0_8_);
  local_9c = local_110.pMin.super_Tuple2<pbrt::Point2,_int>;
  local_94 = local_110.pMax.super_Tuple2<pbrt::Point2,_int>;
  local_118 = &local_9c;
  local_128 = pbrt::begin((Bounds2i *)0x86fa9d);
  pbrt::end((Bounds2i *)in_stack_fffffffffffffe40);
  while (bVar2 = Bounds2iIterator::operator!=(this_00,(Bounds2iIterator *)in_stack_fffffffffffffe48)
        , bVar2) {
    p_00 = Bounds2iIterator::operator*(&local_128);
    in_stack_fffffffffffffe48 = (Tuple2<pbrt::Vector2,_float>)&in_RDI[1].pMax;
    auVar14._0_8_ =
         Point2<float>::operator-
                   ((Point2<float> *)in_stack_fffffffffffffe40,
                    (Point2<int>)in_stack_fffffffffffffe48);
    auVar14._8_56_ = extraout_var_06;
    vmovlpd_avx(auVar14._0_16_);
    Vector2<float>::Vector2
              ((Vector2<float> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
               in_stack_fffffffffffffe38);
    auVar15._0_8_ =
         Tuple2<pbrt::Vector2,float>::operator-
                   ((Tuple2<pbrt::Vector2,_float> *)in_stack_fffffffffffffe40,
                    in_stack_fffffffffffffe48);
    auVar15._8_56_ = extraout_var_07;
    vmovlpd_avx(auVar15._0_16_);
    Point2<float>::Point2<float>
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (Vector2<float>)in_stack_fffffffffffffe40);
    FVar5 = Filter::Evaluate((Filter *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                             ,(Point2f)in_stack_fffffffffffffe40);
    if ((FVar5 != 0.0) || (NAN(FVar5))) {
      pPVar3 = Array2D<pbrt::GBufferFilm::Pixel>::operator[]
                         ((Array2D<pbrt::GBufferFilm::Pixel> *)(in_RDI + 0x31),p_00);
      for (local_184 = 0; local_184 < 3; local_184 = local_184 + 1) {
        in_stack_fffffffffffffe40 = (Tuple2<pbrt::Point2,_float>)(pPVar3->rgbSplat + local_184);
        in_stack_fffffffffffffe3c = FVar5;
        RGB::operator[](local_34,local_184);
        AtomicDouble::Add((AtomicDouble *)CONCAT44(FVar20,uVar19),
                          (double)CONCAT44(uVar18,in_stack_ffffffffffffff78));
      }
    }
    Bounds2iIterator::operator++
              ((Bounds2iIterator *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  return;
}

Assistant:

PBRT_CPU_GPU void GBufferFilm::AddSplat(Point2f p, SampledSpectrum v,
                           const SampledWavelengths &lambda) {
    // NOTE: same code as RGBFilm::AddSplat()...
    CHECK(!v.HasNaNs());
    RGB rgb = sensor->ToSensorRGB(v, lambda);
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue)
        rgb *= maxComponentValue / m;

    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - filter.Radius())),
                         Point2i(Floor(pDiscrete + filter.Radius())) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);
    for (Point2i pi : splatBounds) {
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.rgbSplat[i].Add(wt * rgb[i]);
        }
    }
}